

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_tcp_socket.c
# Opt level: O0

ssize_t amqp_tcp_socket_send_inner(void *base,void *buf,size_t len,int flags)

{
  int iVar1;
  size_t sVar2;
  uint in_ECX;
  size_t in_RDX;
  void *in_RSI;
  long in_RDI;
  ssize_t len_left;
  char *buf_left;
  ssize_t res;
  amqp_tcp_socket_t *self;
  size_t local_40;
  void *local_38;
  
  local_40 = in_RDX;
  local_38 = in_RSI;
  while( true ) {
    while (sVar2 = send(*(int *)(in_RDI + 8),local_38,local_40,in_ECX | 0x4000), (long)sVar2 < 0) {
      iVar1 = amqp_os_socket_error();
      *(int *)(in_RDI + 0x20) = iVar1;
      if (*(int *)(in_RDI + 0x20) != 4) {
        return -9;
      }
    }
    if (sVar2 == local_40) break;
    local_38 = (void *)(sVar2 + (long)local_38);
    local_40 = local_40 - sVar2;
  }
  *(undefined4 *)(in_RDI + 0x20) = 0;
  return 0;
}

Assistant:

static ssize_t
amqp_tcp_socket_send_inner(void *base, const void *buf, size_t len, int flags)
{
  struct amqp_tcp_socket_t *self = (struct amqp_tcp_socket_t *)base;
  ssize_t res;

  const char *buf_left = buf;
  ssize_t len_left = len;

#ifdef MSG_NOSIGNAL
  flags |= MSG_NOSIGNAL;
#endif

start:
  res = send(self->sockfd, buf_left, len_left, flags);

  if (res < 0) {
    self->internal_error = amqp_os_socket_error();
    if (EINTR == self->internal_error) {
      goto start;
    } else {
      res = AMQP_STATUS_SOCKET_ERROR;
    }
  } else {
    if (res == len_left) {
      self->internal_error = 0;
      res = AMQP_STATUS_OK;
    } else {
      buf_left += res;
      len_left -= res;
      goto start;
    }
  }

  return res;
}